

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O2

void __thiscall InputBuffer::syncConsume(InputBuffer *this)

{
  int iVar1;
  
  iVar1 = this->numToConsume;
  while (0 < iVar1) {
    if (this->nMarkers < 1) {
      CircularQueue<int>::removeFirst(&this->queue);
      iVar1 = this->numToConsume;
    }
    else {
      this->markerOffset = this->markerOffset + 1;
    }
    iVar1 = iVar1 + -1;
    this->numToConsume = iVar1;
  }
  return;
}

Assistant:

void InputBuffer::syncConsume() {
	while (numToConsume > 0) {
		if (nMarkers > 0)
		{
			// guess mode -- leave leading characters and bump offset.
			markerOffset++;
		} else {
			// normal mode -- remove first character
			queue.removeFirst();
		}
		numToConsume--;
	}
}